

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional1.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  Foo foo;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  function<void_(int)> f_add_display3;
  function<void_(int)> f_display_obj;
  function<void_(int)> nullfun;
  function<void_(int)> f_add_display2;
  undefined1 local_98 [16];
  code *local_88;
  code *local_80;
  function<void_()> f_display_31337;
  function<void_()> f_display_42;
  function<void_(int)> f_display;
  
  f_display.super__Function_base._M_functor._8_8_ = 0;
  f_display.super__Function_base._M_functor._M_unused._M_object = print_num;
  f_display._M_invoker = std::_Function_handler<void_(int),_void_(*)(int)>::_M_invoke;
  f_display.super__Function_base._M_manager =
       std::_Function_handler<void_(int),_void_(*)(int)>::_M_manager;
  std::function<void_(int)>::operator()(&f_display,-9);
  nullfun.super__Function_base._M_manager = (_Manager_type)0x0;
  nullfun._M_invoker = (_Invoker_type)0x0;
  nullfun.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  nullfun.super__Function_base._M_functor._8_8_ = 0;
  poVar2 = std::operator<<((ostream *)&std::cout,"HenryDbg::tp2----->");
  std::endl<char,std::char_traits<char>>(poVar2);
  f_display_42.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  f_display_42.super__Function_base._M_functor._8_8_ = 0;
  f_display_42._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iZhangHui[P]cplusplus-11/functional1.cpp:38:39)>
       ::_M_invoke;
  f_display_42.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/iZhangHui[P]cplusplus-11/functional1.cpp:38:39)>
       ::_M_manager;
  std::function<void_()>::operator()(&f_display_42);
  local_98._0_8_ = print_num;
  local_98._8_4_ = (_Tuple_impl<0UL,_int>)0x7a69;
  std::function<void()>::function<std::_Bind<void(*(int))(int)>,void>
            ((function<void()> *)&f_display_31337,(_Bind<void_(*(int))(int)> *)local_98);
  std::function<void_()>::operator()(&f_display_31337);
  local_98._0_8_ = Foo::print_add;
  local_98._8_8_ = 0;
  local_80 = std::_Function_handler<void_(const_Foo_&,_int),_void_(Foo::*)(int)_const>::_M_invoke;
  local_88 = std::_Function_handler<void_(const_Foo_&,_int),_void_(Foo::*)(int)_const>::_M_manager;
  foo.num_ = 0x4cb2f;
  std::function<void_(const_Foo_&,_int)>::operator()
            ((function<void_(const_Foo_&,_int)> *)local_98,&foo,1);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = std::_Function_handler<int_(const_Foo_&),_int_Foo::*>::_M_invoke;
  local_128 = std::_Function_handler<int_(const_Foo_&),_int_Foo::*>::_M_manager;
  poVar2 = std::operator<<((ostream *)&std::cout,"num_: ");
  iVar1 = std::function<int_(const_Foo_&)>::operator()
                    ((function<int_(const_Foo_&)> *)&local_138,&foo);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,'\n');
  f_add_display3.super__Function_base._M_functor._M_unused._M_object = Foo::print_add;
  f_add_display3.super__Function_base._M_functor._8_8_ = 0;
  f_add_display3.super__Function_base._M_manager._0_4_ = foo.num_;
  std::function<void(int)>::
  function<std::_Bind<void(Foo::*(Foo,std::_Placeholder<1>))(int)const>,void>
            ((function<void(int)> *)&f_add_display2,
             (_Bind<void_(Foo::*(Foo,_std::_Placeholder<1>))(int)_const> *)&f_add_display3);
  std::function<void_(int)>::operator()(&f_add_display2,2);
  f_display_obj.super__Function_base._M_functor._M_unused._M_object = Foo::print_add;
  f_display_obj.super__Function_base._M_functor._8_8_ = 0;
  f_display_obj.super__Function_base._M_manager = (_Manager_type)&foo;
  std::function<void(int)>::
  function<std::_Bind<void(Foo::*(Foo_const*,std::_Placeholder<1>))(int)const>,void>
            ((function<void(int)> *)&f_add_display3,
             (_Bind<void_(Foo::*(const_Foo_*,_std::_Placeholder<1>))(int)_const> *)&f_display_obj);
  std::function<void_(int)>::operator()(&f_add_display3,3);
  f_display_obj.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  f_display_obj.super__Function_base._M_functor._8_8_ = 0;
  f_display_obj._M_invoker = std::_Function_handler<void_(int),_PrintNum>::_M_invoke;
  f_display_obj.super__Function_base._M_manager =
       std::_Function_handler<void_(int),_PrintNum>::_M_manager;
  std::function<void_(int)>::operator()(&f_display_obj,0x12);
  std::_Function_base::~_Function_base(&f_display_obj.super__Function_base);
  std::_Function_base::~_Function_base(&f_add_display3.super__Function_base);
  std::_Function_base::~_Function_base(&f_add_display2.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  std::_Function_base::~_Function_base((_Function_base *)local_98);
  std::_Function_base::~_Function_base(&f_display_31337.super__Function_base);
  std::_Function_base::~_Function_base(&f_display_42.super__Function_base);
  std::_Function_base::~_Function_base(&nullfun.super__Function_base);
  std::_Function_base::~_Function_base(&f_display.super__Function_base);
  return 0;
}

Assistant:

int main()
{
	// store a free function
	std::function<void(int)> f_display = print_num;
	f_display(-9);

	std::function<void(int)> nullfun;
	if (nullfun) {
		std::cout << "HenryDbg::tp1----->" << std::endl;

	} else {
		std::cout << "HenryDbg::tp2----->" << std::endl;
	}

	// store a lambda
	std::function<void()> f_display_42 = []() { print_num(42); };
	f_display_42();

	// store the result of a call to std::bind
	std::function<void()> f_display_31337 = std::bind(print_num, 31337);
	f_display_31337();

	// store a call to a member function
	std::function<void(const Foo&, int)> f_add_display = &Foo::print_add;
	const Foo foo(314159);
	f_add_display(foo, 1);

	// store a call to a data member accessor
	std::function<int(Foo const&)> f_num = &Foo::num_;
	std::cout << "num_: " << f_num(foo) << '\n';

	// store a call to a member function and object
	using std::placeholders::_1;
	std::function<void(int)> f_add_display2 = std::bind( &Foo::print_add, foo, _1 );
	f_add_display2(2);

	// store a call to a member function and object ptr
	std::function<void(int)> f_add_display3 = std::bind( &Foo::print_add, &foo, _1 );
	f_add_display3(3);

	// store a call to a function object
	std::function<void(int)> f_display_obj = PrintNum();
	f_display_obj(18);
}